

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr.c
# Opt level: O0

void rtr_stop(rtr_socket *rtr_socket)

{
  long lVar1;
  long in_FS_OFFSET;
  rtr_socket *rtr_socket_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lrtr_dbg("RTR Socket: %s()","rtr_stop");
  rtr_change_socket_state(rtr_socket,RTR_SHUTDOWN);
  if (rtr_socket->thread_id != 0) {
    lrtr_dbg("RTR Socket: pthread_cancel()");
    pthread_cancel(rtr_socket->thread_id);
    lrtr_dbg("RTR Socket: pthread_join()");
    pthread_join(rtr_socket->thread_id,(void **)0x0);
    tr_close(rtr_socket->tr_socket);
    rtr_socket->request_session_id = true;
    rtr_socket->serial_number = 0;
    rtr_socket->last_update = 0;
    pfx_table_src_remove(rtr_socket->pfx_table,rtr_socket);
    spki_table_src_remove(rtr_socket->spki_table,rtr_socket);
    aspa_table_src_remove(rtr_socket->aspa_table,rtr_socket,true);
    rtr_socket->thread_id = 0;
    rtr_socket->state = RTR_CLOSED;
  }
  lrtr_dbg("RTR Socket: Socket shut down");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void rtr_stop(struct rtr_socket *rtr_socket)
{
	RTR_DBG("%s()", __func__);
	rtr_change_socket_state(rtr_socket, RTR_SHUTDOWN);
	if (rtr_socket->thread_id != 0) {
		RTR_DBG1("pthread_cancel()");
		pthread_cancel(rtr_socket->thread_id);
		RTR_DBG1("pthread_join()");
		pthread_join(rtr_socket->thread_id, NULL);

		tr_close(rtr_socket->tr_socket);
		rtr_socket->request_session_id = true;
		rtr_socket->serial_number = 0;
		rtr_socket->last_update = 0;
		pfx_table_src_remove(rtr_socket->pfx_table, rtr_socket);
		spki_table_src_remove(rtr_socket->spki_table, rtr_socket);
		aspa_table_src_remove(rtr_socket->aspa_table, rtr_socket, true);
		rtr_socket->thread_id = 0;
		rtr_socket->state = RTR_CLOSED;
	}
	RTR_DBG1("Socket shut down");
}